

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

parsed_pe * peparse::ParsePEFromBuffer(bounded_buffer *buffer)

{
  bounded_buffer *b;
  bool bVar1;
  parsed_pe *p;
  parsed_pe_internal *ppVar2;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  _func_ios_base_ptr_ios_base_ptr *f_01;
  _func_ios_base_ptr_ios_base_ptr *f_02;
  _func_ios_base_ptr_ios_base_ptr *f_03;
  _func_ios_base_ptr_ios_base_ptr *f_04;
  _func_ios_base_ptr_ios_base_ptr *f_05;
  bounded_buffer *remaining;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  bounded_buffer *local_40;
  vector<peparse::section,_std::allocator<peparse::section>_> local_38;
  
  p = (parsed_pe *)operator_new(0x270,(nothrow_t *)&std::nothrow);
  if (p == (parsed_pe *)0x0) {
    err = 1;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_60,0x9be,f);
    std::operator+(&local_80,":",&local_60);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
LAB_00118754:
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    return (parsed_pe *)0x0;
  }
  memset(p,0,0x270);
  p->fileBuffer = buffer;
  ppVar2 = (parsed_pe_internal *)operator_new(0xa8,(nothrow_t *)&std::nothrow);
  if (ppVar2 == (parsed_pe_internal *)0x0) {
    p->internal = (parsed_pe_internal *)0x0;
    deleteBuffer(buffer);
    std::_Vector_base<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>::~_Vector_base
              (&(p->peHeader).rich.Entries.
                super__Vector_base<peparse::rich_entry,_std::allocator<peparse::rich_entry>_>);
    operator_delete(p,0x270);
    err = 1;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_60,0x9ca,f_00);
    std::operator+(&local_80,":",&local_60);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
    goto LAB_00118754;
  }
  memset(ppVar2,0,0xa8);
  p->internal = ppVar2;
  local_40 = (bounded_buffer *)0x0;
  bVar1 = getHeader(buffer,&p->peHeader,&local_40);
  b = local_40;
  if (bVar1) {
    bVar1 = getSections(local_40,p->fileBuffer,&(p->peHeader).nt,&p->internal->secs);
    if (!bVar1) {
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 3;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_60,0x9db,f_01);
      std::operator+(&local_80,":",&local_60);
      std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
      goto LAB_00118754;
    }
    ppVar2 = p->internal;
    std::vector<peparse::section,_std::allocator<peparse::section>_>::vector
              (&local_38,&ppVar2->secs);
    bVar1 = getResources(b,(bounded_buffer *)ppVar2,&local_38,&p->internal->rsrcs);
    std::vector<peparse::section,_std::allocator<peparse::section>_>::~vector(&local_38);
    if (!bVar1) {
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 4;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_60,0x9e2,f_02);
      std::operator+(&local_80,":",&local_60);
      std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
      goto LAB_00118754;
    }
    bVar1 = getExports(p);
    if (!bVar1) {
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 9;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_60,0x9ea,f_03);
      std::operator+(&local_80,":",&local_60);
      std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
      goto LAB_00118754;
    }
    bVar1 = getRelocations(p);
    if (!bVar1) {
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 9;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_60,0x9f2,f_04);
      std::operator+(&local_80,":",&local_60);
      std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
      goto LAB_00118754;
    }
    bVar1 = getDebugDir(p);
    if (!bVar1) {
      deleteBuffer(b);
      DestructParsedPE(p);
      err = 9;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>(&local_60,0x9f9,f_05);
      std::operator+(&local_80,":",&local_60);
      std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
      goto LAB_00118754;
    }
    bVar1 = getImports(p);
    if (bVar1) {
      bVar1 = getSymbolTable(p);
      deleteBuffer(b);
      if (bVar1) {
        return p;
      }
      goto LAB_00118533;
    }
  }
  deleteBuffer(b);
LAB_00118533:
  DestructParsedPE(p);
  return (parsed_pe *)0x0;
}

Assistant:

parsed_pe *ParsePEFromBuffer(bounded_buffer *buffer) {
  // First, create a new parsed_pe structure
  // We pass std::nothrow parameter to new so in case of failure it returns
  // nullptr instead of throwing exception std::bad_alloc.
  parsed_pe *p = new (std::nothrow) parsed_pe();

  if (p == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  // Make a new buffer object to hold just our file data
  p->fileBuffer = buffer;

  p->internal = new (std::nothrow) parsed_pe_internal();

  if (p->internal == nullptr) {
    deleteBuffer(p->fileBuffer);
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  // get header information
  bounded_buffer *remaining = nullptr;
  if (!getHeader(p->fileBuffer, p->peHeader, remaining)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    // err is set by getHeader
    return nullptr;
  }

  bounded_buffer *file = p->fileBuffer;
  if (!getSections(remaining, file, p->peHeader.nt, p->internal->secs)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_SECT);
    return nullptr;
  }

  if (!getResources(remaining, file, p->internal->secs, p->internal->rsrcs)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_RESC);
    return nullptr;
  }

  // Get exports
  if (!getExports(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_MAGIC);
    return nullptr;
  }

  // Get relocations, if exist
  if (!getRelocations(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_MAGIC);
    return nullptr;
  }

  if (!getDebugDir(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    PE_ERR(PEERR_MAGIC);
    return nullptr;
  }

  // Get imports
  if (!getImports(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    return nullptr;
  }

  // Get symbol table
  if (!getSymbolTable(p)) {
    deleteBuffer(remaining);
    DestructParsedPE(p);
    return nullptr;
  }

  deleteBuffer(remaining);

  return p;
}